

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  SyntaxFactory *this_00;
  BumpAllocator *alloc;
  bool bVar1;
  TokenKind endKind;
  SyntaxKind SVar2;
  int iVar3;
  HierarchyInstantiationSyntax *pHVar4;
  PortDeclarationSyntax *pPVar5;
  MemberSyntax *pMVar6;
  CheckerInstantiationSyntax *pCVar7;
  ImmediateAssertionMemberSyntax *pIVar8;
  DPIExportSyntax *pDVar9;
  undefined8 uVar10;
  StatementSyntax *pSVar11;
  ProceduralBlockSyntax *pPVar12;
  ModuleDeclarationSyntax *pMVar13;
  TimeUnitsDeclarationSyntax *pTVar14;
  UdpDeclarationSyntax *pUVar15;
  PropertyDeclarationSyntax *pPVar16;
  IfGenerateSyntax *pIVar17;
  DPIImportSyntax *pDVar18;
  LoopGenerateSyntax *pLVar19;
  GenvarDeclarationSyntax *pGVar20;
  undefined4 extraout_var;
  GenerateRegionSyntax *pGVar21;
  DefParamSyntax *pDVar22;
  CheckerDeclarationSyntax *pCVar23;
  NetAliasSyntax *pNVar24;
  BindDirectiveSyntax *pBVar25;
  CaseGenerateSyntax *pCVar26;
  ContinuousAssignSyntax *pCVar27;
  ConfigDeclarationSyntax *pCVar28;
  CovergroupDeclarationSyntax *pCVar29;
  NamedLabelSyntax *label;
  ImmediateAssertionStatementSyntax *pIVar30;
  SpecparamDeclarationSyntax *pSVar31;
  ClassDeclarationSyntax *pCVar32;
  ElabSystemTaskSyntax *pEVar33;
  PrimitiveInstantiationSyntax *pPVar34;
  SourceLocation SVar35;
  EmptyMemberSyntax *pEVar36;
  ConcurrentAssertionStatementSyntax *pCVar37;
  ConcurrentAssertionMemberSyntax *pCVar38;
  SpecifyBlockSyntax *pSVar39;
  SequenceDeclarationSyntax *pSVar40;
  ModportDeclarationSyntax *pMVar41;
  DataDeclarationSyntax *data;
  CheckerDataDeclarationSyntax *pCVar42;
  PackageImportDeclarationSyntax *pPVar43;
  FunctionDeclarationSyntax *pFVar44;
  Diagnostic *this_01;
  undefined4 extraout_var_00;
  uint uVar45;
  char acVar46 [8];
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  size_type extraout_RDX_03;
  TokenKind TVar47;
  uint32_t offset;
  bool bVar48;
  AttrList attributes;
  Token TVar49;
  SourceRange SVar50;
  Token TVar51;
  Token TVar52;
  string_view arg;
  Token keyword;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  bool anyLocalModules_1;
  Token local_f8;
  Token endgenerate;
  Token token;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  MemberSyntax *member;
  SyntaxNode *local_68;
  SyntaxKind local_60;
  size_t local_58;
  pointer pTStack_50;
  size_type local_48;
  Token local_40;
  
  attributes = parseAttributes(this);
  acVar46 = (char  [8])attributes.size_;
  bVar1 = isHierarchyInstantiation(this,false);
  if (bVar1) {
    pHVar4 = parseHierarchyInstantiation(this,attributes);
    return &pHVar4->super_MemberSyntax;
  }
  bVar1 = isPortDeclaration(this,false);
  if (bVar1) {
    pPVar5 = parsePortDeclaration(this,attributes);
    return &pPVar5->super_MemberSyntax;
  }
  bVar1 = isNetDeclaration(this);
  if (bVar1) {
    pMVar6 = parseNetDeclaration(this,attributes);
    return pMVar6;
  }
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
LAB_002b3349:
    pMVar6 = parseVariableDeclaration(this,attributes);
    return pMVar6;
  }
  token = ParserBase::peek(&this->super_ParserBase);
  uVar45 = token._0_4_ & 0xffff;
  TVar47 = token.kind;
  switch(uVar45) {
  case 0x5f:
    pNVar24 = parseNetAlias(this,attributes);
    return &pNVar24->super_MemberSyntax;
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
switchD_002b3558_caseD_a9:
    TVar49 = ParserBase::consume(&this->super_ParserBase);
    uVar10 = TVar49._0_8_;
    local_f8.info = (Info *)&this->factory;
    local_f8._0_8_ = TVar49.info;
    SVar2 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar49.kind);
    bVar1 = false;
LAB_002b35e3:
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
         CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_,1);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_004703a8;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
    members.stackBase._0_16_ = attributes;
    pSVar11 = parseStatement(this,bVar1,false);
    keyword.info = (Info *)local_f8._0_8_;
    keyword.kind = (short)uVar10;
    keyword._2_1_ = (char)((ulong)uVar10 >> 0x10);
    keyword.numFlags.raw = (char)((ulong)uVar10 >> 0x18);
    keyword.rawLen = (int)((ulong)uVar10 >> 0x20);
    pPVar12 = slang::syntax::SyntaxFactory::proceduralBlock
                        ((SyntaxFactory *)local_f8.info,SVar2,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,keyword,
                         pSVar11);
    return &pPVar12->super_MemberSyntax;
  case 100:
  case 0x68:
  case 0x69:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x7c:
  case 0x7e:
  case 0x80:
  case 0x81:
  case 0x84:
  case 0x85:
  case 0x86:
    break;
  case 0x65:
  case 0x67:
  case 0x82:
    pCVar37 = (ConcurrentAssertionStatementSyntax *)
              parseAssertionStatement(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
    uVar45 = (pCVar37->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement;
    if ((uVar45 < 4) && (uVar45 != 1)) {
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
           CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_,1);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)&PTR_getChild_004703a8;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
      members.stackBase._0_16_ = attributes;
      pIVar30 = slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                          ((SyntaxNode *)pCVar37);
      pIVar8 = slang::syntax::SyntaxFactory::immediateAssertionMember
                         (&this->factory,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,pIVar30);
      return &pIVar8->super_MemberSyntax;
    }
LAB_002b3e8d:
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
         CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_,1);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_004703a8;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
    members.stackBase._0_16_ = attributes;
    pCVar37 = slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                        ((SyntaxNode *)pCVar37);
    pCVar38 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,pCVar37);
    return &pCVar38->super_MemberSyntax;
  case 0x66:
    pCVar27 = parseContinuousAssign(this,attributes);
    return &pCVar27->super_MemberSyntax;
  case 0x6a:
    errorIfAttributes(this,attributes);
    if (acVar46 == (char  [8])0x0) {
      SVar35 = Token::location(&token);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x940005,SVar35);
      pMVar6 = parseGenerateBlock(this);
      return pMVar6;
    }
    goto LAB_002b3dbd;
  case 0x6b:
    pBVar25 = parseBindDirective(this,attributes);
    return &pBVar25->super_MemberSyntax;
  case 0x74:
    pCVar26 = parseCaseGenerateConstruct(this,attributes);
    return &pCVar26->super_MemberSyntax;
  case 0x79:
    pCVar23 = parseCheckerDeclaration(this,attributes);
    return &pCVar23->super_MemberSyntax;
  case 0x7a:
    Token::Token(&local_40);
    pCVar32 = parseClassDeclaration(this,attributes,local_40);
    return &pCVar32->super_MemberSyntax;
  case 0x7b:
    goto switchD_002b34d0_caseD_7b;
  case 0x7d:
    errorIfAttributes(this,attributes);
    pCVar28 = parseConfigDeclaration(this,attributes);
    return &pCVar28->super_MemberSyntax;
  case 0x7f:
    pMVar6 = parseConstraint(this,attributes,
                             (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0));
    return pMVar6;
  case 0x83:
    pCVar29 = parseCovergroupDeclaration(this,attributes);
    return &pCVar29->super_MemberSyntax;
  case 0x87:
switchD_002b3558_caseD_b4:
    TVar49 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar49.kind == ClockingKeyword) {
switchD_002b34d0_caseD_7b:
      pMVar6 = parseClockingDeclaration(this,attributes);
      return pMVar6;
    }
    TVar49 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar47 == DefaultKeyword && TVar49.kind == DisableKeyword) {
      pMVar6 = parseDefaultDisable(this,attributes);
      return pMVar6;
    }
    break;
  case 0x88:
    pDVar22 = parseDefParam(this,attributes);
    return &pDVar22->super_MemberSyntax;
  default:
    switch(uVar45) {
    case 0xa6:
      TVar49 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar49.kind == StringLiteral) {
        pDVar9 = parseDPIExport(this,attributes);
        return &pDVar9->super_MemberSyntax;
      }
      pMVar6 = parseExportDeclaration(this,attributes);
      return pMVar6;
    case 0xa7:
    case 0xaa:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb0:
    case 0xb5:
    case 0xb6:
    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
      break;
    case 0xa8:
      errorIfAttributes(this,attributes);
      pEVar33 = (ElabSystemTaskSyntax *)parseExternMember(this,parentKind,attributes);
LAB_002b3ce0:
      if (pEVar33 != (ElabSystemTaskSyntax *)0x0) {
        return &pEVar33->super_MemberSyntax;
      }
      break;
    case 0xa9:
      goto switchD_002b3558_caseD_a9;
    case 0xab:
      pLVar19 = parseLoopGenerateConstruct(this,attributes);
      return &pLVar19->super_MemberSyntax;
    case 0xb1:
      SVar2 = FunctionDeclaration;
      TVar47 = EndFunctionKeyword;
LAB_002b3e66:
      pFVar44 = parseFunctionDeclaration(this,attributes,SVar2,TVar47,parentKind);
      return &pFVar44->super_MemberSyntax;
    case 0xb2:
      errorIfAttributes(this,attributes);
      local_f8 = ParserBase::consume(&this->super_ParserBase);
      Token::Token(&endgenerate);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
      anyLocalModules_1 = false;
      bVar1 = false;
      while( true ) {
        TVar49 = ParserBase::peek(&this->super_ParserBase);
        if ((TVar49.kind == EndOfFile) || (TVar49.kind == EndGenerateKeyword)) break;
        pMVar6 = parseMember(this,GenerateRegion,&anyLocalModules_1);
        member = pMVar6;
        bVar48 = pMVar6 == (MemberSyntax *)0x0;
        if (bVar48) {
          ParserBase::skipToken
                    (&this->super_ParserBase,
                     (optional<slang::DiagCode>)((uint6)((byte)~bVar1 & 1) << 0x20 | 0x350005));
          bVar1 = bVar48;
        }
        else {
          checkMemberAllowed(this,&pMVar6->super_SyntaxNode,GenerateRegion);
          SmallVectorBase<slang::syntax::MemberSyntax*>::
          emplace_back<slang::syntax::MemberSyntax*const&>
                    ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
          bVar1 = bVar48;
        }
      }
      if (anyLocalModules_1 == true) {
        SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::pop_back(&(this->moduleDeclStack).
                    super_SmallVectorBase<ska::flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  );
      }
      endgenerate = ParserBase::expect(&this->super_ParserBase,EndGenerateKeyword);
      iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                        (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                         (EVP_PKEY_CTX *)endgenerate.info);
      SmallVectorBase<slang::syntax::MemberSyntax_*>::~SmallVectorBase
                (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
      local_60 = SyntaxList;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
           CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_,1);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)&PTR_getChild_004703a8;
      _member = (Token)ZEXT816(0x473020);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
      members.stackBase._0_16_ = attributes;
      pTStack_50 = (pointer)CONCAT44(extraout_var,iVar3);
      pGVar21 = slang::syntax::SyntaxFactory::generateRegion
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,local_f8,
                           (SyntaxList<slang::syntax::MemberSyntax> *)&member,endgenerate);
      return &pGVar21->super_MemberSyntax;
    case 0xb3:
      pGVar20 = parseGenvarDeclaration(this,attributes);
      return &pGVar20->super_MemberSyntax;
    case 0xb4:
      goto switchD_002b3558_caseD_b4;
    case 0xb7:
      pIVar17 = parseIfGenerateConstruct(this,attributes);
      return &pIVar17->super_MemberSyntax;
    case 0xbe:
      TVar49 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar49.kind == StringLiteral) {
        pDVar18 = parseDPIImport(this,attributes);
        return &pDVar18->super_MemberSyntax;
      }
      pPVar43 = parseImportDeclaration(this,attributes);
      return &pPVar43->super_MemberSyntax;
    default:
      switch(uVar45) {
      case 0xe9:
      case 0xf0:
        goto switchD_002b3617_caseD_e9;
      case 0xea:
      case 0xeb:
      case 0xec:
      case 0xed:
      case 0xef:
        goto switchD_002b3617_caseD_ea;
      case 0xee:
        pUVar15 = parseUdpDeclaration(this,attributes);
        return &pUVar15->super_MemberSyntax;
      case 0xf1:
        pPVar16 = parsePropertyDeclaration(this,attributes);
        return &pPVar16->super_MemberSyntax;
      default:
        if (uVar45 - 0x12e < 2) {
          errorIfAttributes(this,attributes);
          pTVar14 = parseTimeUnitsDeclaration(this,attributes);
          return &pTVar14->super_MemberSyntax;
        }
        if (uVar45 == 2) {
          TVar49 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar49.kind == Colon) {
            TVar49 = ParserBase::peek(&this->super_ParserBase,2);
            uVar10 = TVar49._0_8_;
            uVar45 = TVar49.kind - 0x65;
            if ((uVar45 < 0x1e) && ((0x20000005U >> (uVar45 & 0x1f) & 1) != 0)) {
              local_f8.kind = (short)uVar10;
              local_f8._2_1_ = (char)((ulong)uVar10 >> 0x10);
              local_f8.numFlags.raw = (char)((ulong)uVar10 >> 0x18);
              local_f8.rawLen = (int)((ulong)uVar10 >> 0x20);
              TVar49 = ParserBase::consume(&this->super_ParserBase);
              this_00 = &this->factory;
              TVar52 = ParserBase::expect(&this->super_ParserBase,Colon);
              label = slang::syntax::SyntaxFactory::namedLabel(this_00,TVar49,TVar52);
              pSVar11 = parseAssertionStatement(this,label,(AttrList)ZEXT816(0));
              uVar45 = (pSVar11->super_SyntaxNode).kind - ImmediateAssertStatement;
              if ((uVar45 < 4) && (uVar45 != 1)) {
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
                     CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_
                              ,1);
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
                     (pointer)&PTR_getChild_004703a8;
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
                members.stackBase._0_16_ = attributes;
                pIVar30 = slang::syntax::SyntaxNode::
                          as<slang::syntax::ImmediateAssertionStatementSyntax>
                                    (&pSVar11->super_SyntaxNode);
                anyLocalModules =
                     (bool *)slang::syntax::SyntaxFactory::immediateAssertionMember
                                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax>
                                                 *)&members,pIVar30);
              }
              else {
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
                     CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_
                              ,1);
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
                     (pointer)&PTR_getChild_004703a8;
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
                members.stackBase._0_16_ = attributes;
                pCVar37 = slang::syntax::SyntaxNode::
                          as<slang::syntax::ConcurrentAssertionStatementSyntax>
                                    (&pSVar11->super_SyntaxNode);
                anyLocalModules =
                     (bool *)slang::syntax::SyntaxFactory::concurrentAssertionMember
                                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax>
                                                 *)&members,pCVar37);
              }
              uVar10 = local_f8._0_8_;
            }
            uVar45 = ((uint)uVar10 & 0xffff) - 0x65;
            if ((uVar45 < 0x1e) && ((0x20000005U >> (uVar45 & 0x1f) & 1) != 0)) {
              return &((ConcurrentAssertionMemberSyntax *)anyLocalModules)->super_MemberSyntax;
            }
          }
          TVar49 = ParserBase::peek(&this->super_ParserBase,1);
          if ((TVar49.kind == Hash) ||
             (TVar49 = ParserBase::peek(&this->super_ParserBase,1), TVar49.kind == OpenParenthesis))
          {
            pPVar34 = parsePrimitiveInstantiation(this,attributes);
            return &pPVar34->super_MemberSyntax;
          }
          TVar49 = ParserBase::peek(&this->super_ParserBase,1);
          if (((TVar49.kind == DoubleColon) &&
              (TVar49 = ParserBase::peek(&this->super_ParserBase,2), TVar49.kind == Identifier)) &&
             (TVar49 = ParserBase::peek(&this->super_ParserBase,3), TVar49.kind == Identifier)) {
            pCVar7 = parseCheckerInstantiation(this,attributes);
            return &pCVar7->super_MemberSyntax;
          }
          pMVar6 = parseVariableDeclaration(this,attributes);
          return pMVar6;
        }
        if (uVar45 == 3) {
          pEVar33 = parseElabSystemTask(this,attributes);
          goto LAB_002b3ce0;
        }
        if (uVar45 != 0x15) {
          if (uVar45 == 0xc1) {
            TVar49 = ParserBase::consume(&this->super_ParserBase);
            uVar10 = TVar49._0_8_;
            local_f8.info = (Info *)&this->factory;
            local_f8._0_8_ = TVar49.info;
            SVar2 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar49.kind);
            bVar1 = true;
            goto LAB_002b35e3;
          }
          if (uVar45 == 0xc9) {
            TVar49 = ParserBase::peek(&this->super_ParserBase,1);
            if (TVar49.kind == ClassKeyword) {
LAB_002b3ca5:
              TVar49 = ParserBase::consume(&this->super_ParserBase);
              pCVar32 = parseClassDeclaration(this,attributes,TVar49);
              return &pCVar32->super_MemberSyntax;
            }
switchD_002b3617_caseD_e9:
            pMVar13 = parseModule(this,attributes,parentKind,anyLocalModules);
            return &pMVar13->super_MemberSyntax;
          }
          if (uVar45 == 0xd6) goto switchD_002b3617_caseD_e9;
          if (uVar45 == 0xd9) {
            pMVar41 = parseModportDeclaration(this,attributes);
            return &pMVar41->super_MemberSyntax;
          }
          if (uVar45 == 0xda) goto switchD_002b3617_caseD_e9;
          if (uVar45 == 0xfa) {
            TVar52 = ParserBase::consume(&this->super_ParserBase);
            uVar10 = TVar52._0_8_;
            local_f8.kind = (short)uVar10;
            local_f8._2_1_ = (char)((ulong)uVar10 >> 0x10);
            local_f8.numFlags.raw = (char)((ulong)uVar10 >> 0x18);
            local_f8.rawLen = (int)((ulong)uVar10 >> 0x20);
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
                 CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_,1);
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
                 (pointer)&PTR_getChild_004703a8;
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
            members.stackBase._0_16_ = attributes;
            data = parseDataDeclaration(this,(AttrList)ZEXT816(0));
            TVar49 = local_f8;
            TVar51.info = TVar52.info;
            TVar51.kind = local_f8.kind;
            TVar51._2_1_ = local_f8._2_1_;
            TVar51.numFlags.raw = local_f8.numFlags.raw;
            TVar51.rawLen = local_f8.rawLen;
            local_f8 = TVar49;
            pCVar42 = slang::syntax::SyntaxFactory::checkerDataDeclaration
                                (&this->factory,
                                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                                 TVar51,data);
            return &pCVar42->super_MemberSyntax;
          }
          if (uVar45 == 0x106) {
            pCVar37 = parseConcurrentAssertion
                                (this,(NamedLabelSyntax *)0x0,(AttrList)(ZEXT416(0) << 0x40));
            goto LAB_002b3e8d;
          }
          if (uVar45 == 0x113) {
            pSVar40 = parseSequenceDeclaration(this,attributes);
            return &pSVar40->super_MemberSyntax;
          }
          if (uVar45 == 0x11b) {
            errorIfAttributes(this,attributes);
            pSVar39 = parseSpecifyBlock(this,attributes);
            return &pSVar39->super_MemberSyntax;
          }
          if (uVar45 == 0x11c) {
            pSVar31 = parseSpecparam(this,attributes);
            return &pSVar31->super_MemberSyntax;
          }
          if (uVar45 == 0x12a) {
            SVar2 = TaskDeclaration;
            TVar47 = EndTaskKeyword;
            goto LAB_002b3e66;
          }
          if (uVar45 == 0x146) {
            TVar49 = ParserBase::peek(&this->super_ParserBase,1);
            if (TVar49.kind == ClassKeyword) goto LAB_002b3ca5;
          }
          else if (uVar45 == 0x156) {
            TVar49 = ParserBase::peek(&this->super_ParserBase,1);
            if (((TVar49.kind == DoubleColon) &&
                (TVar49 = ParserBase::peek(&this->super_ParserBase,2), TVar49.kind == Identifier))
               && (TVar49 = ParserBase::peek(&this->super_ParserBase,3), TVar49.kind == Identifier))
            {
              pCVar7 = parseCheckerInstantiation(this,attributes);
              return &pCVar7->super_MemberSyntax;
            }
            goto LAB_002b3349;
          }
          goto switchD_002b3617_caseD_ea;
        }
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
             CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_,1);
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
             (pointer)&PTR_getChild_004703a8;
        local_60 = TokenList;
        local_48 = 0;
        local_58 = 0;
        pTStack_50 = (pointer)0x0;
        _member = (Token)ZEXT816(0x46feb0);
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
        members.stackBase._0_16_ = attributes;
        TVar51 = ParserBase::consume(&this->super_ParserBase);
      }
      goto LAB_002b3e39;
    }
  }
switchD_002b3617_caseD_ea:
  bVar1 = slang::syntax::SyntaxFacts::isGateType(TVar47);
  if (bVar1) {
    pPVar34 = parsePrimitiveInstantiation(this,attributes);
    return &pPVar34->super_MemberSyntax;
  }
  bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier(TVar47);
  if (bVar1) {
    Token::Token((Token *)&member);
    offset = 0;
    do {
      offset = offset + 1;
      _member = ParserBase::peek(&this->super_ParserBase,offset);
      bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier((TokenKind)member);
    } while (bVar1);
    if ((TokenKind)member == ConstraintKeyword) {
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 4;
      src = extraout_RDX;
      while (bVar1 = offset != 0, offset = offset - 1, bVar1) {
        endgenerate = ParserBase::consume(&this->super_ParserBase);
        SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                  ((SmallVectorBase<slang::parsing::Token> *)&members,&endgenerate);
        src = extraout_RDX_00;
        if ((endgenerate.kind != StaticKeyword) &&
           (bVar1 = slang::syntax::SyntaxFacts::isConstraintQualifier(endgenerate.kind),
           src = extraout_RDX_01, bVar1)) {
          SVar50 = Token::range(&endgenerate);
          this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x60005,SVar50);
          arg = Token::valueText(&endgenerate);
          Diagnostic::operator<<(this_01,arg);
          src = extraout_RDX_02;
        }
      }
      iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)&members,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      qualifiers.data_._4_4_ = extraout_var_00;
      qualifiers.data_._0_4_ = iVar3;
      qualifiers.size_ = extraout_RDX_03;
      pMVar6 = parseConstraint(this,attributes,qualifiers);
      SmallVectorBase<slang::parsing::Token>::~SmallVectorBase
                ((SmallVectorBase<slang::parsing::Token> *)&members);
      return pMVar6;
    }
    if (((TokenKind)member == TaskKeyword) || ((TokenKind)member == FunctionKeyword)) {
      SVar50 = Token::range(&token);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7e0005,SVar50);
      while (bVar1 = offset != 0, offset = offset - 1, bVar1) {
        ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      }
      SVar2 = TaskDeclaration;
      if ((TokenKind)member == FunctionKeyword) {
        SVar2 = FunctionDeclaration;
      }
      endKind = slang::syntax::SyntaxFacts::getSkipToKind((TokenKind)member);
      pFVar44 = parseFunctionDeclaration(this,attributes,SVar2,endKind,parentKind);
      return &pFVar44->super_MemberSyntax;
    }
  }
  if (acVar46 == (char  [8])0x0) {
    pEVar36 = (EmptyMemberSyntax *)0x0;
  }
  else {
LAB_002b3dbd:
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
         CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._4_4_,1);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_004703a8;
    local_60 = TokenList;
    local_48 = 0;
    local_58 = 0;
    pTStack_50 = (pointer)0x0;
    _member = (Token)ZEXT816(0x46feb0);
    alloc = (this->super_ParserBase).alloc;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement = acVar46;
    members.stackBase._0_16_ = attributes;
    SVar35 = Token::location(&token);
    TVar51 = Token::createMissing(alloc,Semicolon,SVar35);
LAB_002b3e39:
    pEVar36 = slang::syntax::SyntaxFactory::emptyMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                         (TokenList *)&member,TVar51);
  }
  return &pEVar36->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {});
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc));
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}